

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O3

void __thiscall spvtools::opt::CodeMetrics::Analyze(CodeMetrics *this,Loop *loop)

{
  IRContext *this_00;
  mapped_type mVar1;
  CodeMetrics *pCVar2;
  char cVar3;
  uint32_t uVar4;
  BasicBlock *pBVar5;
  mapped_type *pmVar6;
  Instruction *pIVar7;
  _Hash_node_base *p_Var8;
  size_t bb_size;
  mapped_type local_90;
  CodeMetrics *local_88;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  _Any_data *local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  CFG *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = loop->context_;
  local_88 = this;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  local_58 = (this_00->cfg_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
             super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  local_88->roi_size_ = 0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_88);
  p_Var8 = (loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      pBVar5 = CFG::block(local_58,*(uint32_t *)&p_Var8[1]._M_nxt);
      local_90 = 0;
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = &local_90;
      local_78 = &local_50;
      local_38 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:681:21)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:681:21)>
                 ::_M_manager;
      local_70 = 0;
      local_60 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:306:7)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:306:7)>
                 ::_M_manager;
      pIVar7 = (pBVar5->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar7 != (Instruction *)0x0) {
        local_80._M_head_impl = pIVar7;
        std::
        _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:681:21)>
        ::_M_invoke(local_78,&local_80._M_head_impl);
      }
      for (pIVar7 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar7 != &(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar7 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        local_80._M_head_impl = pIVar7;
        if (local_68 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar3 = (*local_60)(&local_78,&local_80);
        if (cVar3 == '\0') break;
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,3);
      }
      mVar1 = local_90;
      pIVar7 = (pBVar5->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar4 = 0;
      if (pIVar7->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      pCVar2 = local_88;
      local_78 = (_Any_data *)CONCAT44(local_78._4_4_,uVar4);
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_88,(key_type *)&local_78);
      *pmVar6 = mVar1;
      pCVar2->roi_size_ = pCVar2->roi_size_ + local_90;
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void CodeMetrics::Analyze(const Loop& loop) {
  CFG& cfg = *loop.GetContext()->cfg();

  roi_size_ = 0;
  block_sizes_.clear();

  for (uint32_t id : loop.GetBlocks()) {
    const BasicBlock* bb = cfg.block(id);
    size_t bb_size = 0;
    bb->ForEachInst([&bb_size](const Instruction* insn) {
      if (insn->opcode() == spv::Op::OpLabel) return;
      if (insn->IsNop()) return;
      if (insn->opcode() == spv::Op::OpPhi) return;
      bb_size++;
    });
    block_sizes_[bb->id()] = bb_size;
    roi_size_ += bb_size;
  }
}